

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(cmLocalNinjaGenerator *this,ostream *os)

{
  char *__s;
  cmGlobalNinjaGenerator *this_00;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string rulesFilePath;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string ninjaRulesFile;
  cmGlobalNinjaGenerator *ng;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::operator<<(os,"# Include auxiliary files.\n\n");
  this_00 = GetGlobalNinjaGenerator(this);
  __s = cmGlobalNinjaGenerator::NINJA_RULES_FILE;
  ninjaRulesFile.field_2._8_8_ = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  cmGlobalNinjaGenerator::NinjaOutputPath((string *)local_40,this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  cmGlobalNinjaGenerator::EncodePath
            ((string *)local_98,(cmGlobalNinjaGenerator *)ninjaRulesFile.field_2._8_8_,
             (string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Include rules file.",&local_b9);
  cmGlobalNinjaGenerator::WriteInclude(os,(string *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::operator<<(os,"\n");
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Include auxiliary files.\n\n";
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string const ninjaRulesFile =
    ng->NinjaOutputPath(cmGlobalNinjaGenerator::NINJA_RULES_FILE);
  std::string const rulesFilePath = ng->EncodePath(ninjaRulesFile);
  cmGlobalNinjaGenerator::WriteInclude(os, rulesFilePath,
                                       "Include rules file.");
  os << "\n";
}